

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

Datatype * __thiscall TypeOpIntSright::getInputLocal(TypeOpIntSright *this,PcodeOp *op,int4 slot)

{
  TypeFactory *this_00;
  Datatype *pDVar1;
  
  this_00 = (this->super_TypeOpBinary).super_TypeOp.tlst;
  if (slot == 1) {
    pDVar1 = TypeFactory::getBaseNoChar
                       (this_00,(op->inrefs).
                                super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                super__Vector_impl_data._M_start[1]->size,TYPE_INT);
    return pDVar1;
  }
  pDVar1 = TypeFactory::getBase
                     (this_00,(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[slot]->size,
                      (this->super_TypeOpBinary).metain);
  return pDVar1;
}

Assistant:

Datatype *TypeOpIntSright::getInputLocal(const PcodeOp *op,int4 slot) const

{
  if (slot==1)
    return tlst->getBaseNoChar(op->getIn(1)->getSize(),TYPE_INT);
  return TypeOpBinary::getInputLocal(op,slot);
}